

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O0

OutputArea * __thiscall
Outputs::Display::BufferingScanTarget::get_output_area
          (OutputArea *__return_storage_ptr__,BufferingScanTarget *this)

{
  PointerSet __i;
  PointerSet PVar1;
  uint local_28;
  PointerSet read_ahead_pointers;
  PointerSet submit_pointers;
  BufferingScanTarget *this_local;
  
  __i = std::atomic<Outputs::Display::BufferingScanTarget::PointerSet>::load
                  (&this->submit_pointers_,memory_order_acquire);
  PVar1 = std::atomic<Outputs::Display::BufferingScanTarget::PointerSet>::load
                    (&this->read_ahead_pointers_,memory_order_relaxed);
  (__return_storage_ptr__->start).line = (ulong)PVar1 >> 0x30;
  (__return_storage_ptr__->end).line = (ulong)__i >> 0x30;
  (__return_storage_ptr__->start).scan = (ulong)PVar1 >> 0x20 & 0xffff;
  (__return_storage_ptr__->end).scan = (ulong)__i >> 0x20 & 0xffff;
  local_28 = PVar1.write_area;
  (__return_storage_ptr__->start).write_area_x = local_28 & 0x7ff;
  (__return_storage_ptr__->start).write_area_y = (int)local_28 >> 0xb & 0xffff;
  read_ahead_pointers.write_area = __i.write_area;
  (__return_storage_ptr__->end).write_area_x = read_ahead_pointers.write_area & 0x7ff;
  (__return_storage_ptr__->end).write_area_y = read_ahead_pointers.write_area >> 0xb & 0xffff;
  std::atomic<Outputs::Display::BufferingScanTarget::PointerSet>::store
            (&this->read_ahead_pointers_,__i,memory_order_relaxed);
  __return_storage_ptr__->counter = this->output_area_counter_;
  this->output_area_counter_ = this->output_area_counter_ + 1;
  return __return_storage_ptr__;
}

Assistant:

BufferingScanTarget::OutputArea BufferingScanTarget::get_output_area() {
	// The area to draw is that between the read pointers, representing wherever reading
	// last stopped, and the submit pointers, representing all the new data that has been
	// cleared for submission.
	const auto submit_pointers = submit_pointers_.load(std::memory_order::memory_order_acquire);
	const auto read_ahead_pointers = read_ahead_pointers_.load(std::memory_order::memory_order_relaxed);
	std::atomic_thread_fence(std::memory_order::memory_order_acquire);

	OutputArea area;

	area.start.line = read_ahead_pointers.line;
	area.end.line = submit_pointers.line;

	area.start.scan = read_ahead_pointers.scan;
	area.end.scan = submit_pointers.scan;

	area.start.write_area_x = TextureAddressGetX(read_ahead_pointers.write_area);
	area.start.write_area_y = TextureAddressGetY(read_ahead_pointers.write_area);
	area.end.write_area_x = TextureAddressGetX(submit_pointers.write_area);
	area.end.write_area_y = TextureAddressGetY(submit_pointers.write_area);

	// Update the read-ahead pointers.
	read_ahead_pointers_.store(submit_pointers, std::memory_order::memory_order_relaxed);

#ifndef NDEBUG
	area.counter = output_area_counter_;
	++output_area_counter_;
#endif

	return area;
}